

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_cast.cpp
# Opt level: O1

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundCastExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  FunctionLocalState *pFVar1;
  _Head_base<0UL,_duckdb::ExpressionState_*,_false> state_00;
  reference result_00;
  reference pvVar2;
  type expr_00;
  string error_message;
  CastParameters parameters;
  string local_80;
  CastParameters local_60;
  
  pFVar1 = (FunctionLocalState *)state[1]._vptr_ExpressionState;
  DataChunk::Reset(&state->intermediate_chunk);
  result_00 = vector<duckdb::Vector,_true>::operator[](&(state->intermediate_chunk).data,0);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::operator[](&state->child_states,0);
  state_00._M_head_impl =
       (pvVar2->
       super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
       .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl;
  expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (&expr->child);
  Execute(this,expr_00,state_00._M_head_impl,sel,count,result_00);
  local_60.local_state.ptr = pFVar1;
  if (expr->try_cast == true) {
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_60.cast_data.ptr =
         (expr->bound_cast).cast_data.
         super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
         super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
         .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
    local_60.strict = false;
    local_60.error_message = &local_80;
    local_60.nullify_parent = false;
    local_60.query_location.index =
         (expr->super_Expression).super_BaseExpression.query_location.index;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    (*(expr->bound_cast).function)(result_00,result,count,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  else {
    local_60.cast_data.ptr =
         (expr->bound_cast).cast_data.
         super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
         super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
         .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
    local_60.strict = false;
    local_60.error_message = (string *)0x0;
    local_60.nullify_parent = false;
    local_60.query_location.index =
         (expr->super_Expression).super_BaseExpression.query_location.index;
    (*(expr->bound_cast).function)(result_00,result,count,&local_60);
  }
  return;
}

Assistant:

void ExpressionExecutor::Execute(const BoundCastExpression &expr, ExpressionState *state, const SelectionVector *sel,
                                 idx_t count, Vector &result) {
	auto lstate = ExecuteFunctionState::GetFunctionState(*state);

	// resolve the child
	state->intermediate_chunk.Reset();

	auto &child = state->intermediate_chunk.data[0];
	auto child_state = state->child_states[0].get();

	Execute(*expr.child, child_state, sel, count, child);
	if (expr.try_cast) {
		string error_message;
		CastParameters parameters(expr.bound_cast.cast_data.get(), false, &error_message, lstate);
		parameters.query_location = expr.GetQueryLocation();
		expr.bound_cast.function(child, result, count, parameters);
	} else {
		// cast it to the type specified by the cast expression
		D_ASSERT(result.GetType() == expr.return_type);
		CastParameters parameters(expr.bound_cast.cast_data.get(), false, nullptr, lstate);
		parameters.query_location = expr.GetQueryLocation();
		expr.bound_cast.function(child, result, count, parameters);
	}
}